

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errstr.cpp
# Opt level: O3

BSTR BstrGetResourceString(int32 isz)

{
  char16 *psz;
  BSTR pWVar1;
  
  psz = LoadResourceStr(isz & 0xffff);
  if ((psz == (char16 *)0x0) || (*psz == L'\0')) {
    pWVar1 = (BSTR)0x0;
  }
  else {
    pWVar1 = SysAllocString(psz);
  }
  return pWVar1;
}

Assistant:

_NOINLINE // Don't inline. This function needs 2KB stack.
BSTR BstrGetResourceString(int32 isz)
{
    // NOTE - isz is expected to be HRESULT

#ifdef _WIN32
    OLECHAR szT[1024];

    if (!FGetResourceString(isz, szT,
        sizeof(szT) / sizeof(szT[0]) - 1))
    {
        return NULL;
    }
#else
    const char16* LoadResourceStr(UINT id);

    UINT id = (WORD)isz;
    const char16* szT = LoadResourceStr(id);
    if (!szT || !szT[0])
    {
        return NULL;
    }

#endif

    return SysAllocString(szT);
}